

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

ParseResult *
tinyusdz::prim::anon_unknown_0::ParseExtentAttribute
          (ParseResult *__return_storage_ptr__,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *table,string *prop_name,Property *prop,string *name,
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *target)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  size_type sVar5;
  AttrMeta *pAVar6;
  AttrMeta *pAVar7;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  value_type *v;
  optional<tinyusdz::Animatable<tinyusdz::Extent>_> local_118;
  undefined1 local_d0 [8];
  optional<tinyusdz::Animatable<tinyusdz::Extent>_> av;
  PrimVar *var;
  bool has_connections;
  undefined1 local_68 [8];
  string attr_type_name;
  Attribute *attr;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *target_local;
  string *name_local;
  Property *prop_local;
  string *prop_name_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *table_local;
  ParseResult *ret;
  
  attr._7_1_ = false;
  ParseResult::ParseResult(__return_storage_ptr__);
  iVar3 = ::std::__cxx11::string::compare((string *)prop_name);
  if (iVar3 == 0) {
    sVar5 = ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(table,(key_type *)name);
    if (sVar5 != 0) {
      __return_storage_ptr__->code = AlreadyProcessed;
      attr._7_1_ = true;
      goto LAB_0028bf11;
    }
    attr_type_name.field_2._8_8_ = Property::get_attribute(prop);
    Attribute::type_name_abi_cxx11_((string *)local_68,(Attribute *)attr_type_name.field_2._8_8_);
    TVar4 = Property::get_property_type(prop);
    if (TVar4 == EmptyAttrib) {
      TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::set_value_empty(target);
      pAVar6 = Attribute::metas((Attribute *)attr_type_name.field_2._8_8_);
      pAVar7 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::metas(target);
      AttrMetas::operator=(pAVar7,pAVar6);
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(table,name);
      __return_storage_ptr__->code = Success;
      attr._7_1_ = true;
      bVar1 = true;
    }
    else {
      TVar4 = Property::get_property_type(prop);
      if (TVar4 == Attrib) {
        bVar1 = Attribute::has_connections((Attribute *)attr_type_name.field_2._8_8_);
        if (bVar1) {
          paths = Attribute::connections((Attribute *)attr_type_name.field_2._8_8_);
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::set_connections(target,paths);
        }
        bVar2 = Attribute::is_blocked((Attribute *)attr_type_name.field_2._8_8_);
        if (bVar2) {
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::set_blocked(target,true);
        }
        av.contained._56_8_ = Attribute::get_var((Attribute *)attr_type_name.field_2._8_8_);
        bVar2 = primvar::PrimVar::has_default((PrimVar *)av.contained._56_8_);
        if ((bVar2) ||
           (bVar2 = primvar::PrimVar::has_timesamples((PrimVar *)av.contained._56_8_), bVar2)) {
          ConvertToAnimatable<tinyusdz::Extent>(&local_118,(PrimVar *)av.contained._56_8_);
          nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::
          optional<tinyusdz::Animatable<tinyusdz::Extent>,_0>
                    ((optional<tinyusdz::Animatable<tinyusdz::Extent>_> *)local_d0,&local_118);
          nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::~optional
                    (&local_118);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_d0);
          if (bVar1) {
            v = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                          ((optional<tinyusdz::Animatable<tinyusdz::Extent>_> *)local_d0);
            TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::set_value(target,v);
          }
          else {
            __return_storage_ptr__->code = InternalError;
            ::std::__cxx11::string::operator=
                      ((string *)&__return_storage_ptr__->err,
                       "Converting Attribute data failed. Maybe TimeSamples have values with different types?"
                      );
          }
          attr._7_1_ = !bVar1;
          bVar1 = !bVar1;
          nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::~optional
                    ((optional<tinyusdz::Animatable<tinyusdz::Extent>_> *)local_d0);
          if (!bVar1) {
            pAVar6 = Attribute::metas((Attribute *)attr_type_name.field_2._8_8_);
            pAVar7 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::metas(target);
            AttrMetas::operator=(pAVar7,pAVar6);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(table,name);
            __return_storage_ptr__->code = Success;
            attr._7_1_ = true;
            bVar1 = true;
          }
        }
        else if (bVar1) {
          pAVar6 = Attribute::metas((Attribute *)attr_type_name.field_2._8_8_);
          pAVar7 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::metas(target);
          AttrMetas::operator=(pAVar7,pAVar6);
          ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(table,name);
          __return_storage_ptr__->code = Success;
          attr._7_1_ = true;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      else {
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->err,"Invalid Property type(internal error)");
        __return_storage_ptr__->code = InternalError;
        attr._7_1_ = true;
        bVar1 = true;
      }
    }
    ::std::__cxx11::string::~string((string *)local_68);
    if (bVar1) goto LAB_0028bf11;
  }
  __return_storage_ptr__->code = Unmatched;
  attr._7_1_ = true;
LAB_0028bf11:
  if (!attr._7_1_) {
    ParseResult::~ParseResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static ParseResult ParseExtentAttribute(std::set<std::string> &table, /* inout */
  const std::string prop_name,
  const Property &prop,
  const std::string &name,
  TypedAttribute<Animatable<Extent>> &target) /* out */
{
  ParseResult ret;

#if 0
  if (prop_name.compare(name + ".connect") == 0) {
    std::string propname = removeSuffix(name, ".connect");
    if (table.count(propname)) {
      DCOUT("Already processed: " << prop_name);
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }
    if (prop.is_connection()) {
      const Attribute &attr = prop.get_attribute();
      if (attr.is_connection()) {
        target.set_connections(attr.connections());
        //target.variability = prop.attrib.variability;
        target.metas() = prop.get_attribute().metas();
        table.insert(propname);
        ret.code = ParseResult::ResultCode::Success;
        DCOUT("Added as property with connection: " << propname);
        return ret;
      } else {
        ret.code = ParseResult::ResultCode::InvalidConnection;
        ret.err = "Connection target not found.";
        return ret;
      }
    } else {
      ret.code = ParseResult::ResultCode::InternalError;
      ret.err = "Internal error. Unsupported/Unimplemented property type.";
      return ret;
    }
#endif
  if (prop_name.compare(name) == 0) {
    if (table.count(name)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }

    const Attribute &attr = prop.get_attribute();

    std::string attr_type_name = attr.type_name();
    if (prop.get_property_type() == Property::Type::EmptyAttrib) {
      DCOUT("Added prop with empty value: " << name);
      target.set_value_empty();
      target.metas() = attr.metas();
      table.insert(name);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    } else if (prop.get_property_type() == Property::Type::Attrib) {

      //bool has_default{false};
      bool has_connections{false};

      if (attr.has_connections()) {
        target.set_connections(attr.connections());
        //target.variability = prop.attrib.variability;
        //target.metas() = prop.get_attribute().metas();
        //table.insert(prop_name);
        //ret.code = ParseResult::ResultCode::Success;
        //return ret;
        has_connections = true;
      }

      DCOUT("Adding typed extent attribute: " << name);

      if (attr.is_blocked()) {
        // e.g. "float3[] extent = None"
        target.set_blocked(true);
      }

#if 0
      } else {
        
        //
        // No variability check. allow `uniform extent`(promote to varying)
        //
        if (auto pv = attr.get_value<std::vector<value::float3>>()) {
          if (pv.value().size() != 2) {
            ret.code = ParseResult::ResultCode::TypeMismatch;
            ret.err = fmt::format("`extent` must be `float3[2]`, but got array size {}", pv.value().size());
            return ret;
          }

          Extent ext;
          ext.lower = pv.value()[0];
          ext.upper = pv.value()[1];

          //target.set_value(ext);
          animatable_value.set(ext);
        } else {
          ret.code = ParseResult::ResultCode::TypeMismatch;
          ret.err = fmt::format("`extent` must be `float3[]` type, but got `{}`", attr.type_name());
          return ret;
        }
      }

      if (attr.get_var().has_timesamples()) {
        // e.g. "float3[] extent.timeSamples = ..."

        if (auto av = ConvertToAnimatable<Extent>(attr.get_var())) {
          animatable_value.set(av.value().get_timesamples());
          //target.set_value(anim);
          
          has_timesamples = true;
        } else {
          // Conversion failed.
          DCOUT("ConvertToAnimatable failed.");
          ret.code = ParseResult::ResultCode::InternalError;
          ret.err = "Converting Attribute data failed. Maybe TimeSamples have values with different types or invalid array size?";
          return ret;
        }
      }

      if (has_default || has_timesamples) {
        DCOUT("Added Extent attribute: " << name);
        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      } else {
        DCOUT("Internal error.");
        ret.code = ParseResult::ResultCode::InternalError;
        ret.err = "Internal error. Invalid Attribute data";
        return ret;
      }
#else
      
      const auto &var = attr.get_var();

      if (var.has_default() || var.has_timesamples()) {
        if (auto av = ConvertToAnimatable<Extent>(var)) {
          target.set_value(av.value());
        } else {
          DCOUT("ConvertToAnimatable failed.");
          ret.code = ParseResult::ResultCode::InternalError;
          ret.err = "Converting Attribute data failed. Maybe TimeSamples have values with different types?";
          return ret;
        }

        DCOUT("Added typed extent attribute: " << name);

        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      }

      if (has_connections) {
        DCOUT("Added Extent connection attribute: " << name);
        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      }

#endif

    } else {
      DCOUT("Invalid Property.type");
      ret.err = "Invalid Property type(internal error)";
      ret.code = ParseResult::ResultCode::InternalError;
      return ret;
    }

  }

  ret.code = ParseResult::ResultCode::Unmatched;
  return ret;
}